

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::Session(Session *this)

{
  ostream *poVar1;
  logic_error *this_00;
  NonCopyable *in_RDI;
  string msg;
  ConfigData *in_stack_ffffffffffffff80;
  allocator local_39;
  string local_38 [56];
  
  NonCopyable::NonCopyable(in_RDI);
  in_RDI->_vptr_NonCopyable = (_func_int **)&PTR__Session_00201538;
  makeCommandLineParser();
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             0x194203);
  ConfigData::ConfigData(in_stack_ffffffffffffff80);
  Ptr<Catch::Config>::Ptr((Ptr<Catch::Config> *)(in_RDI + 0x27));
  if ((alreadyInstantiated & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"Only one instance of Catch::Session can ever be used",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    poVar1 = cerr();
    poVar1 = std::operator<<(poVar1,local_38);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  alreadyInstantiated = 1;
  return;
}

Assistant:

Session()
        : m_cli( makeCommandLineParser() ) {
            if( alreadyInstantiated ) {
                std::string msg = "Only one instance of Catch::Session can ever be used";
                Catch::cerr() << msg << std::endl;
                throw std::logic_error( msg );
            }
            alreadyInstantiated = true;
        }